

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O0

aiMesh * __thiscall Assimp::SkeletonMeshBuilder::CreateMesh(SkeletonMeshBuilder *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  aiMesh *this_00;
  size_type sVar4;
  ulong uVar5;
  aiVector3D *paVar6;
  iterator __first;
  iterator __last;
  ulong *puVar7;
  reference pvVar8;
  void *pvVar9;
  reference pvVar10;
  reference pvVar11;
  ulong uVar12;
  aiBone **ppaVar13;
  iterator __first_00;
  iterator __last_00;
  aiFace *paVar14;
  ulong uVar15;
  float fVar16;
  aiVector3t<float> aVar17;
  aiFace *local_130;
  aiVector3t<float> *local_108;
  aiVector3t<float> *local_e0;
  uint local_a8;
  float fStack_a4;
  uint n;
  float local_9c;
  aiVector3t<float> local_98;
  aiVector3t<float> local_88;
  aiVector3t<float> local_78;
  aiVector3t<float> local_68;
  aiVector3t<float> local_58;
  undefined1 local_4c [8];
  aiVector3D nor;
  aiFace *outface;
  Face *inface;
  uint a;
  aiMesh *mesh;
  SkeletonMeshBuilder *this_local;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    (&this->mVertices);
  this_00->mNumVertices = (uint)sVar4;
  uVar12 = CONCAT44(0,this_00->mNumVertices);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar12;
  uVar5 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  paVar6 = (aiVector3D *)operator_new__(uVar5);
  if (uVar12 != 0) {
    local_e0 = paVar6;
    do {
      aiVector3t<float>::aiVector3t(local_e0);
      local_e0 = local_e0 + 1;
    } while (local_e0 != paVar6 + uVar12);
  }
  this_00->mVertices = paVar6;
  __first = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                      (&this->mVertices);
  __last = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                     (&this->mVertices);
  std::
  copy<__gnu_cxx::__normal_iterator<aiVector3t<float>*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
            ((__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
              )__first._M_current,
             (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
              )__last._M_current,this_00->mVertices);
  uVar12 = CONCAT44(0,this_00->mNumVertices);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  uVar5 = SUB168(auVar2 * ZEXT816(0xc),0);
  if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  paVar6 = (aiVector3D *)operator_new__(uVar5);
  if (uVar12 != 0) {
    local_108 = paVar6;
    do {
      aiVector3t<float>::aiVector3t(local_108);
      local_108 = local_108 + 1;
    } while (local_108 != paVar6 + uVar12);
  }
  this_00->mNormals = paVar6;
  sVar4 = std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::size(&this->mFaces);
  this_00->mNumFaces = (uint)sVar4;
  uVar12 = CONCAT44(0,this_00->mNumFaces);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12;
  uVar5 = SUB168(auVar3 * ZEXT816(0x10),0);
  uVar15 = uVar5 + 8;
  if (SUB168(auVar3 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar15);
  *puVar7 = uVar12;
  paVar14 = (aiFace *)(puVar7 + 1);
  if (uVar12 != 0) {
    local_130 = paVar14;
    do {
      aiFace::aiFace(local_130);
      local_130 = local_130 + 1;
    } while (local_130 != paVar14 + uVar12);
  }
  this_00->mFaces = paVar14;
  for (inface._4_4_ = 0; inface._4_4_ < this_00->mNumFaces; inface._4_4_ = inface._4_4_ + 1) {
    pvVar8 = std::
             vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ::operator[](&this->mFaces,(ulong)inface._4_4_);
    nor._4_8_ = this_00->mFaces + inface._4_4_;
    ((aiFace *)nor._4_8_)->mNumIndices = 3;
    pvVar9 = operator_new__(0xc);
    *(void **)(nor._4_8_ + 8) = pvVar9;
    **(uint **)(nor._4_8_ + 8) = pvVar8->mIndices[0];
    *(uint *)(*(long *)(nor._4_8_ + 8) + 4) = pvVar8->mIndices[1];
    *(uint *)(*(long *)(nor._4_8_ + 8) + 8) = pvVar8->mIndices[2];
    pvVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                        (&this->mVertices,(ulong)pvVar8->mIndices[2]);
    pvVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                        (&this->mVertices,(ulong)pvVar8->mIndices[0]);
    aVar17 = ::operator-(pvVar10,pvVar11);
    local_68.z = aVar17.z;
    local_58.z = local_68.z;
    local_68._0_8_ = aVar17._0_8_;
    local_58.x = local_68.x;
    local_58.y = local_68.y;
    local_68 = aVar17;
    pvVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                        (&this->mVertices,(ulong)pvVar8->mIndices[1]);
    pvVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                        (&this->mVertices,(ulong)pvVar8->mIndices[0]);
    aVar17 = ::operator-(pvVar10,pvVar11);
    local_88.z = aVar17.z;
    local_78.z = local_88.z;
    local_88._0_8_ = aVar17._0_8_;
    local_78.x = local_88.x;
    local_78.y = local_88.y;
    local_88 = aVar17;
    aVar17 = operator^(&local_58,&local_78);
    local_98._0_8_ = aVar17._0_8_;
    local_4c._0_4_ = local_98.x;
    local_4c._4_4_ = local_98.y;
    local_98.z = aVar17.z;
    nor.x = local_98.z;
    local_98 = aVar17;
    fVar16 = aiVector3t<float>::Length((aiVector3t<float> *)local_4c);
    if (fVar16 < 1e-05) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&stack0xffffffffffffff5c,1.0,0.0,0.0);
      local_4c._0_4_ = fStack_a4;
      local_4c._4_4_ = n;
      nor.x = local_9c;
    }
    for (local_a8 = 0; local_a8 < 3; local_a8 = local_a8 + 1) {
      paVar6 = this_00->mNormals + pvVar8->mIndices[local_a8];
      paVar6->x = (float)local_4c._0_4_;
      paVar6->y = (float)local_4c._4_4_;
      paVar6->z = nor.x;
    }
  }
  sVar4 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::size(&this->mBones);
  this_00->mNumBones = (uint)sVar4;
  auVar1 = ZEXT416(this_00->mNumBones) * ZEXT816(8);
  uVar12 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  ppaVar13 = (aiBone **)operator_new__(uVar12);
  this_00->mBones = ppaVar13;
  __first_00 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::begin(&this->mBones);
  __last_00 = std::vector<aiBone_*,_std::allocator<aiBone_*>_>::end(&this->mBones);
  std::
  copy<__gnu_cxx::__normal_iterator<aiBone**,std::vector<aiBone*,std::allocator<aiBone*>>>,aiBone**>
            ((__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>)
             __first_00._M_current,
             (__normal_iterator<aiBone_**,_std::vector<aiBone_*,_std::allocator<aiBone_*>_>_>)
             __last_00._M_current,this_00->mBones);
  this_00->mMaterialIndex = 0;
  return this_00;
}

Assistant:

aiMesh* SkeletonMeshBuilder::CreateMesh()
{
    aiMesh* mesh = new aiMesh();

    // add points
    mesh->mNumVertices = static_cast<unsigned int>(mVertices.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy( mVertices.begin(), mVertices.end(), mesh->mVertices);

    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // add faces
    mesh->mNumFaces = static_cast<unsigned int>(mFaces.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];
    for( unsigned int a = 0; a < mesh->mNumFaces; a++)
    {
        const Face& inface = mFaces[a];
        aiFace& outface = mesh->mFaces[a];
        outface.mNumIndices = 3;
        outface.mIndices = new unsigned int[3];
        outface.mIndices[0] = inface.mIndices[0];
        outface.mIndices[1] = inface.mIndices[1];
        outface.mIndices[2] = inface.mIndices[2];

        // Compute per-face normals ... we don't want the bones to be smoothed ... they're built to visualize
        // the skeleton, so it's good if there's a visual difference to the rest of the geometry
        aiVector3D nor = ((mVertices[inface.mIndices[2]] - mVertices[inface.mIndices[0]]) ^
            (mVertices[inface.mIndices[1]] - mVertices[inface.mIndices[0]]));

        if (nor.Length() < 1e-5) /* ensure that FindInvalidData won't remove us ...*/
            nor = aiVector3D(1.0,0.0,0.0);

        for (unsigned int n = 0; n < 3; ++n)
            mesh->mNormals[inface.mIndices[n]] = nor;
    }

    // add the bones
    mesh->mNumBones = static_cast<unsigned int>(mBones.size());
    mesh->mBones = new aiBone*[mesh->mNumBones];
    std::copy( mBones.begin(), mBones.end(), mesh->mBones);

    // default
    mesh->mMaterialIndex = 0;

    return mesh;
}